

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

QItemSelection * __thiscall
QItemSelectionModelPrivate::expandSelection
          (QItemSelection *__return_storage_ptr__,QItemSelectionModelPrivate *this,
          QItemSelection *selection,SelectionFlags command)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *pQVar1;
  Data *pDVar2;
  QAbstractItemModel *pQVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_b0;
  QModelIndex local_98;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = (selection->super_QList<QItemSelectionRange>).d.size;
  if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 0x60) == 0 && uVar8 == 0) {
    pDVar2 = (selection->super_QList<QItemSelectionRange>).d.d;
    (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = pDVar2;
    (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr =
         (selection->super_QList<QItemSelectionRange>).d.ptr;
    (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           1);
      UNLOCK();
    }
  }
  else {
    (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
    (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
    (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
    if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 0x20) != 0) {
      if (uVar8 == 0) goto LAB_0045cb0f;
      pQVar1 = &this->model;
      lVar6 = 0;
      uVar7 = 0;
      do {
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent
                  (&local_58,
                   (QPersistentModelIndex *)
                   ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->tl).d + lVar6));
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar3 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        iVar4 = (*(pQVar3->super_QObject)._vptr_QObject[0x10])(pQVar3,&local_58);
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar3 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar5 = QPersistentModelIndex::row
                          ((QPersistentModelIndex *)
                           ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->tl).d +
                           lVar6));
        (*(pQVar3->super_QObject)._vptr_QObject[0xc])(&local_78,pQVar3,(ulong)uVar5,0,&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar3 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar5 = QPersistentModelIndex::row
                          ((QPersistentModelIndex *)
                           ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->br).d +
                           lVar6));
        (*(pQVar3->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar3,(ulong)uVar5,(ulong)(iVar4 - 1),&local_58);
        QItemSelection::QItemSelection((QItemSelection *)&local_b0,&local_78,&local_98);
        QItemSelection::merge
                  (__return_storage_ptr__,(QItemSelection *)&local_b0,(SelectionFlags)0x2);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_b0);
        uVar7 = uVar7 + 1;
        uVar8 = (selection->super_QList<QItemSelectionRange>).d.size;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < uVar8);
    }
    if (uVar8 != 0 &&
        ((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 0x40) != 0) {
      pQVar1 = &this->model;
      lVar6 = 0;
      uVar8 = 0;
      do {
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent
                  (&local_58,
                   (QPersistentModelIndex *)
                   ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->tl).d + lVar6));
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar3 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        iVar4 = (*(pQVar3->super_QObject)._vptr_QObject[0xf])(pQVar3,&local_58);
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar3 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar5 = QPersistentModelIndex::column
                          ((QPersistentModelIndex *)
                           ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->tl).d +
                           lVar6));
        (*(pQVar3->super_QObject)._vptr_QObject[0xc])(&local_78,pQVar3,0,(ulong)uVar5,&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar3 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar5 = QPersistentModelIndex::column
                          ((QPersistentModelIndex *)
                           ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->br).d +
                           lVar6));
        (*(pQVar3->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar3,(ulong)(iVar4 - 1),(ulong)uVar5,&local_58);
        QItemSelection::QItemSelection((QItemSelection *)&local_b0,&local_78,&local_98);
        QItemSelection::merge
                  (__return_storage_ptr__,(QItemSelection *)&local_b0,(SelectionFlags)0x2);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_b0);
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar8 < (ulong)(selection->super_QList<QItemSelectionRange>).d.size);
    }
  }
LAB_0045cb0f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QItemSelection QItemSelectionModelPrivate::expandSelection(const QItemSelection &selection,
                                                           QItemSelectionModel::SelectionFlags command) const
{
    if (selection.isEmpty() && !((command & QItemSelectionModel::Rows) ||
                                 (command & QItemSelectionModel::Columns)))
        return selection;

    QItemSelection expanded;
    if (command & QItemSelectionModel::Rows) {
        for (int i = 0; i < selection.size(); ++i) {
            QModelIndex parent = selection.at(i).parent();
            int colCount = model->columnCount(parent);
            QModelIndex tl = model->index(selection.at(i).top(), 0, parent);
            QModelIndex br = model->index(selection.at(i).bottom(), colCount - 1, parent);
            //we need to merge because the same row could have already been inserted
            expanded.merge(QItemSelection(tl, br), QItemSelectionModel::Select);
        }
    }
    if (command & QItemSelectionModel::Columns) {
        for (int i = 0; i < selection.size(); ++i) {
            QModelIndex parent = selection.at(i).parent();
            int rowCount = model->rowCount(parent);
            QModelIndex tl = model->index(0, selection.at(i).left(), parent);
            QModelIndex br = model->index(rowCount - 1, selection.at(i).right(), parent);
            //we need to merge because the same column could have already been inserted
            expanded.merge(QItemSelection(tl, br), QItemSelectionModel::Select);
        }
    }
    return expanded;
}